

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilTruth.c
# Opt level: O3

uint Extra_TruthSemiCanonicize(uint *pInOut,uint *pAux,int nVars,char *pCanonPerm,short *pStore)

{
  ushort *puVar1;
  short sVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  uint *pIn;
  bool bVar10;
  
  uVar3 = 1 << ((byte)nVars - 5 & 0x1f);
  if (nVars < 6) {
    uVar3 = 1;
  }
  uVar9 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    iVar6 = 0;
  }
  else {
    uVar8 = uVar9 + 1;
    iVar6 = 0;
    do {
      uVar5 = (pInOut[uVar8 - 2] >> 1 & 0x55555555) + (pInOut[uVar8 - 2] & 0x55555555);
      uVar5 = (uVar5 >> 2 & 0x33333333) + (uVar5 & 0x33333333);
      uVar5 = (uVar5 >> 4 & 0x7070707) + (uVar5 & 0x7070707);
      uVar5 = (uVar5 >> 8 & 0xf000f) + (uVar5 & 0xf000f);
      iVar6 = (uVar5 >> 0x10) + iVar6 + (uVar5 & 0xffff);
      uVar8 = uVar8 - 1;
    } while (1 < uVar8);
  }
  iVar7 = uVar3 * 0x10;
  if (((iVar6 != iVar7 && SBORROW4(iVar6,iVar7) == (int)(iVar6 + uVar3 * -0x10) < 0) ||
      ((uVar5 = 0, iVar6 == iVar7 && ((*pInOut & 1) != 0)))) &&
     (uVar5 = 1 << ((byte)nVars & 0x1f), 0 < (int)uVar3)) {
    uVar8 = uVar9 + 1;
    do {
      pInOut[uVar8 - 2] = ~pInOut[uVar8 - 2];
      uVar8 = uVar8 - 1;
    } while (1 < uVar8);
  }
  Extra_TruthCountOnesInCofs(pInOut,nVars,pStore);
  if (0 < nVars) {
    uVar8 = 0;
    do {
      sVar2 = pStore[uVar8 * 2];
      if (pStore[uVar8 * 2 + 1] < sVar2) {
        uVar5 = uVar5 | 1 << ((uint)uVar8 & 0x1f);
        pStore[uVar8 * 2] = pStore[uVar8 * 2 + 1];
        pStore[uVar8 * 2 + 1] = sVar2;
        Extra_TruthChangePhase(pInOut,nVars,(uint)uVar8);
      }
      uVar8 = uVar8 + 1;
    } while ((uint)nVars != uVar8);
  }
  bVar10 = false;
  do {
    if (nVars < 2) break;
    uVar8 = 0;
    bVar4 = false;
    pIn = pInOut;
    do {
      pInOut = pIn;
      if (pStore[uVar8 * 2 + 2] < pStore[uVar8 * 2]) {
        puVar1 = (ushort *)(pCanonPerm + uVar8);
        *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
        bVar10 = (bool)(bVar10 ^ 1);
        *(ulong *)(pStore + uVar8 * 2) =
             CONCAT44((int)*(undefined8 *)(pStore + uVar8 * 2),
                      (int)((ulong)*(undefined8 *)(pStore + uVar8 * 2) >> 0x20));
        Extra_TruthSwapAdjacentVars(pAux,pIn,nVars,(int)uVar8);
        bVar4 = true;
        pInOut = pAux;
        pAux = pIn;
      }
      uVar8 = uVar8 + 1;
      pIn = pInOut;
    } while (nVars - 1 != uVar8);
  } while (bVar4);
  if ((0 < (int)uVar3) && (bVar10)) {
    uVar9 = uVar9 + 1;
    do {
      pAux[uVar9 - 2] = pInOut[uVar9 - 2];
      uVar9 = uVar9 - 1;
    } while (1 < uVar9);
  }
  return uVar5;
}

Assistant:

unsigned Extra_TruthSemiCanonicize( unsigned * pInOut, unsigned * pAux, int nVars, char * pCanonPerm, short * pStore )
{
    unsigned * pIn = pInOut, * pOut = pAux, * pTemp;
    int nWords = Extra_TruthWordNum( nVars );
    int i, Temp, fChange, Counter, nOnes;//, k, j, w, Limit;
    unsigned uCanonPhase;

    // canonicize output
    uCanonPhase = 0;
    nOnes = Extra_TruthCountOnes(pIn, nVars);
    if ( (nOnes > nWords * 16) || ((nOnes == nWords * 16) && (pIn[0] & 1)) )
    {
        uCanonPhase |= (1 << nVars);
        Extra_TruthNot( pIn, pIn, nVars );
    }

    // collect the minterm counts
    Extra_TruthCountOnesInCofs( pIn, nVars, pStore );

    // canonicize phase
    for ( i = 0; i < nVars; i++ )
    {
        if ( pStore[2*i+0] <= pStore[2*i+1] )
            continue;
        uCanonPhase |= (1 << i);
        Temp = pStore[2*i+0];
        pStore[2*i+0] = pStore[2*i+1];
        pStore[2*i+1] = Temp;
        Extra_TruthChangePhase( pIn, nVars, i );
    }

//    Extra_PrintHexadecimal( stdout, pIn, nVars );
//    printf( "\n" );

    // permute
    Counter = 0;
    do {
        fChange = 0;
        for ( i = 0; i < nVars-1; i++ )
        {
            if ( pStore[2*i] <= pStore[2*(i+1)] )
                continue;
            Counter++;
            fChange = 1;

            Temp = pCanonPerm[i];
            pCanonPerm[i] = pCanonPerm[i+1];
            pCanonPerm[i+1] = Temp;

            Temp = pStore[2*i];
            pStore[2*i] = pStore[2*(i+1)];
            pStore[2*(i+1)] = Temp;

            Temp = pStore[2*i+1];
            pStore[2*i+1] = pStore[2*(i+1)+1];
            pStore[2*(i+1)+1] = Temp;

            Extra_TruthSwapAdjacentVars( pOut, pIn, nVars, i );
            pTemp = pIn; pIn = pOut; pOut = pTemp;
        }
    } while ( fChange );

/*
    Extra_PrintBinary( stdout, &uCanonPhase, nVars+1 ); printf( " : " );
    for ( i = 0; i < nVars; i++ )
        printf( "%d=%d/%d  ", pCanonPerm[i], pStore[2*i], pStore[2*i+1] );
    printf( "  C = %d\n", Counter );
    Extra_PrintHexadecimal( stdout, pIn, nVars );
    printf( "\n" );
*/

/*
    // process symmetric variable groups
    uSymms = 0;
    for ( i = 0; i < nVars-1; i++ )
    {
        if ( pStore[2*i] != pStore[2*(i+1)] ) // i and i+1 cannot be symmetric
            continue;
        if ( pStore[2*i] != pStore[2*i+1] )
            continue;
        if ( Extra_TruthVarsSymm( pIn, nVars, i, i+1 ) )
            continue;
        if ( Extra_TruthVarsAntiSymm( pIn, nVars, i, i+1 ) )
            Extra_TruthChangePhase( pIn, nVars, i+1 );
    }
*/

/*
    // process symmetric variable groups
    uSymms = 0;
    for ( i = 0; i < nVars-1; i++ )
    {
        if ( pStore[2*i] != pStore[2*(i+1)] ) // i and i+1 cannot be symmetric
            continue;
        // i and i+1 can be symmetric
        // find the end of this group
        for ( k = i+1; k < nVars; k++ )
            if ( pStore[2*i] != pStore[2*k] ) 
                break;
        Limit = k;
        assert( i < Limit-1 );
        // go through the variables in this group
        for ( j = i + 1; j < Limit; j++ )
        {
            // check symmetry
            if ( Extra_TruthVarsSymm( pIn, nVars, i, j ) )
            {
                uSymms |= (1 << j);
                continue;
            }
            // they are phase-unknown
            if ( pStore[2*i] == pStore[2*i+1] ) 
            {
                if ( Extra_TruthVarsAntiSymm( pIn, nVars, i, j ) )
                {
                    Extra_TruthChangePhase( pIn, nVars, j );
                    uCanonPhase ^= (1 << j);
                    uSymms |= (1 << j);
                    continue;
                }
            }

            // they are not symmetric - move j as far as it goes in the group
            for ( k = j; k < Limit-1; k++ )
            {
                Counter++;

                Temp = pCanonPerm[k];
                pCanonPerm[k] = pCanonPerm[k+1];
                pCanonPerm[k+1] = Temp;

                assert( pStore[2*k] == pStore[2*(k+1)] );
                Extra_TruthSwapAdjacentVars( pOut, pIn, nVars, k );
                pTemp = pIn; pIn = pOut; pOut = pTemp;
            }
            Limit--;
            j--;
        }
        i = Limit - 1;
    }
*/

    // swap if it was moved an even number of times
    if ( Counter & 1 )
        Extra_TruthCopy( pOut, pIn, nVars );
    return uCanonPhase;
}